

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probabilities.cpp
# Opt level: O2

double __thiscall probabilities::probabilityPoisson(probabilities *this,int k,double deltaT)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (this->super_Process).lambda;
  iVar1 = 0;
  if (0 < k) {
    iVar1 = k;
  }
  dVar5 = 1.0;
  dVar6 = 1.0;
  dVar4 = 1.0;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dVar6 = dVar6 * dVar3 * deltaT;
    dVar5 = dVar5 * dVar4;
    dVar4 = dVar4 + 1.0;
  }
  dVar3 = exp(-dVar3 * deltaT);
  return (dVar3 * dVar6) / dVar5;
}

Assistant:

double probabilities::probabilityPoisson(int k, double deltaT) {
    double temp1 = 1.0, temp2 = 1.0, p;
    for (int i = 1; i <= k; i++){
        temp1 *= lambda*deltaT;
        temp2 *= i;
    }
    p = temp1*exp(-lambda*deltaT)/temp2;

    return p;
}